

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpretdfd.c
# Opt level: O1

InterpretDFDResult
interpretDFD(uint32_t *DFD,InterpretedDFDChannel *R,InterpretedDFDChannel *G,
            InterpretedDFDChannel *B,InterpretedDFDChannel *A,uint32_t *wordBytes)

{
  InterpretDFDResult IVar1;
  uint uVar2;
  InterpretDFDResult IVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  InterpretedDFDChannel *pIVar12;
  InterpretDFDResult IVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  InterpretDFDResult local_7c;
  
  uVar9 = (DFD[2] >> 0x12) - 6;
  local_7c = i_UNSUPPORTED_CHANNEL_TYPES;
  if (3 < uVar9) {
    R->offset = 0;
    R->size = 0;
    G->offset = 0;
    G->size = 0;
    B->offset = 0;
    B->size = 0;
    A->offset = 0;
    A->size = 0;
    local_7c = i_UNSUPPORTED_MULTIPLE_PLANES;
    if ((DFD[5] < 0x100) && (DFD[6] == 0)) {
      uVar9 = uVar9 >> 2;
      IVar1 = i_LITTLE_ENDIAN_FORMAT_BIT;
      lVar7 = 0;
      do {
        uVar2 = *(uint *)((long)DFD + lVar7 + 0x1c);
        if (((uVar2 & 7) == 0) && (((uVar2 >> 0x10) + 1 & 7) == 0)) {
          bVar24 = false;
        }
        else {
          IVar1 = i_PACKED_FORMAT_BIT;
          bVar24 = true;
        }
      } while ((!bVar24) &&
              (bVar24 = (ulong)(uVar9 + (uVar9 == 0)) * 0x10 + -0x10 != lVar7, lVar7 = lVar7 + 0x10,
              bVar24));
      uVar2 = DFD[3] & 0xff;
      uVar10 = uVar9 + (uVar9 == 0);
      uVar21 = 0;
      uVar18 = 0;
      uVar19 = 0;
      bVar15 = 0;
      uVar14 = 0;
      do {
        uVar8 = DFD[uVar21 + 7];
        if ((int)uVar8 < 0) {
          bVar24 = (float)DFD[(ulong)((int)uVar21 + 9U & 0xfffffffd) + 1] != 1.0;
          uVar16 = 0;
        }
        else {
          uVar20 = DFD[(ulong)((int)uVar21 + 9U & 0xfffffffd) + 1];
          bVar24 = uVar20 < (((uVar8 & 0x40000000) == 0) + 1 << ((byte)(uVar8 >> 0x10) & 0x1f)) - 1
                   && 1 < uVar20;
          uVar16 = (uint)bVar24;
          bVar24 = (bool)(~bVar24 & uVar20 != 1);
        }
        uVar18 = uVar18 | (uVar8 & 0x40000000) >> 0x1e;
        uVar14 = uVar14 | uVar16;
        uVar19 = uVar19 | uVar8 >> 0x1f;
        bVar15 = bVar15 | (uVar8 & 0xff0000) != 0 & bVar24;
        uVar21 = uVar21 + 4;
      } while (uVar10 * 4 != uVar21);
      IVar3 = uVar18 << 4;
      IVar13 = uVar14 * 0x20 + (uint)bVar15 * 8 | uVar19 << 6 | IVar3 | IVar1;
      if (uVar2 == 2) {
        IVar13 = IVar13 | (i_YUVSDA_FORMAT_BIT|i_COMPRESSED_FORMAT_BIT|i_NORMALIZED_FORMAT_BIT);
        lVar7 = 0;
        bVar24 = false;
        do {
          uVar14 = *(byte *)((long)DFD + lVar7 + 0x1f) & 0xf;
          if (0xf < uVar14) {
            return i_UNSUPPORTED_CHANNEL_TYPES;
          }
          if ((0x8007U >> uVar14 & 1) == 0) {
            if ((0x6000U >> uVar14 & 1) == 0) {
              return i_UNSUPPORTED_CHANNEL_TYPES;
            }
            bVar24 = true;
          }
          lVar7 = lVar7 + 0x10;
        } while ((ulong)uVar10 << 4 != lVar7);
        lVar7 = 0;
        uVar10 = 0;
        do {
          bVar15 = *(byte *)((long)DFD + lVar7 + 0x1e);
          uVar14 = bVar15 + 1;
          if (bVar15 < uVar10) {
            uVar14 = uVar10;
          }
          uVar10 = uVar14;
          lVar7 = lVar7 + 0x10;
        } while ((ulong)(uVar9 + (uVar9 == 0)) << 4 != lVar7);
        iVar4 = 0;
        do {
          uVar14 = 1 << ((byte)iVar4 & 0x1f);
          if (uVar10 - 1 < uVar14) goto LAB_001ceed7;
          iVar4 = iVar4 + 1;
        } while (iVar4 != 0x20);
        uVar14 = 0;
LAB_001ceed7:
        *wordBytes = (uVar14 << (sbyte)IVar1) >> 3;
        IVar3 = i_UNSUPPORTED_CHANNEL_TYPES;
      }
      else {
        if (uVar2 == 1) {
          if ((DFD[3] & 0xff0000) == 0x20000) {
            IVar13 = IVar13 | i_SRGB_FORMAT_BIT;
          }
          lVar7 = 0;
          do {
            if (*(int *)((long)DFD + lVar7 + 0x20) != 0) {
              return i_UNSUPPORTED_MULTIPLE_SAMPLE_LOCATIONS;
            }
            lVar7 = lVar7 + 0x10;
          } while ((ulong)uVar10 << 4 != lVar7);
          IVar3 = i_UNSUPPORTED_MULTIPLE_SAMPLE_LOCATIONS;
        }
        bVar24 = false;
      }
      local_7c = i_UNSUPPORTED_CHANNEL_TYPES;
      if (uVar2 - 1 < 2) {
        uVar21 = (ulong)(uVar9 + (uVar9 == 0));
        lVar7 = 0;
        do {
          if ((*(byte *)((long)DFD + lVar7 + 0x1f) & 0xf) - 0xd < 2) {
            bVar24 = true;
          }
          lVar7 = lVar7 + 0x10;
        } while (uVar21 << 4 != lVar7);
        if (!bVar24) {
          puVar11 = DFD + 7;
          bVar23 = true;
          uVar17 = 1;
          do {
            if (SUB41(uVar18,0) == ((*puVar11 >> 0x1e & 1) == 0)) {
              bVar15 = 0;
              IVar3 = i_UNSUPPORTED_MIXED_CHANNELS;
            }
            else {
              bVar15 = -1 < (int)*puVar11 ^ (byte)uVar19;
              if (bVar15 == 0) {
                IVar3 = i_UNSUPPORTED_MIXED_CHANNELS;
              }
            }
            if (bVar15 == 0) break;
            bVar23 = uVar17 < uVar9;
            puVar11 = puVar11 + 4;
            bVar22 = uVar17 != uVar21;
            uVar17 = uVar17 + 1;
          } while (bVar22);
          if (bVar23) {
            return IVar3;
          }
        }
        local_7c = IVar13;
        if ((IVar13 & i_PACKED_FORMAT_BIT) == i_LITTLE_ENDIAN_FORMAT_BIT) {
          puVar11 = DFD + 7;
          uVar10 = 0xffffffff;
          bVar23 = false;
          bVar22 = true;
          uVar18 = 0;
          uVar14 = 0;
          uVar21 = 1;
          do {
            uVar19 = *puVar11;
            uVar8 = uVar19 >> 0x18 & 0xf;
            bVar25 = false;
            if (uVar8 < 0xd) {
              pIVar12 = R;
              if (((uVar8 != 0) && (pIVar12 = G, uVar8 != 1)) && (pIVar12 = B, uVar8 != 2))
              goto LAB_001cf170;
LAB_001cf0a5:
              uVar16 = uVar19 >> 3 & 0x1fff;
              uVar19 = (uVar19 >> 0x10 & 0xff) + 1 >> 3;
              if (uVar8 == uVar10) {
                if (uVar16 == uVar14 - 1) {
                  if ((!bVar23) ||
                     ((local_7c & i_BIG_ENDIAN_FORMAT_BIT) != i_LITTLE_ENDIAN_FORMAT_BIT)) {
                    local_7c = local_7c | i_BIG_ENDIAN_FORMAT_BIT;
                    pIVar12->offset = uVar16;
LAB_001cf189:
                    uVar5 = pIVar12->size + uVar19;
                    pIVar12->size = uVar5;
                    bVar23 = true;
                    uVar8 = uVar10;
                    goto LAB_001cf1a0;
                  }
                  bVar25 = false;
                  IVar3 = i_UNSUPPORTED_ERROR_BIT;
                  bVar23 = true;
                }
                else {
                  if (uVar16 == uVar18 + uVar14) {
                    if ((!bVar23) ||
                       ((local_7c & i_BIG_ENDIAN_FORMAT_BIT) == i_LITTLE_ENDIAN_FORMAT_BIT))
                    goto LAB_001cf189;
                    bVar23 = true;
                  }
LAB_001cf1af:
                  bVar25 = false;
                  IVar3 = i_UNSUPPORTED_ERROR_BIT;
                }
              }
              else {
                if (pIVar12->size != 0) {
                  uVar10 = uVar8;
                  uVar14 = uVar16;
                  uVar18 = uVar19;
                  if ((uVar2 != 2) || (uVar8 != 0)) goto LAB_001cf1af;
                  if ((pIVar12 == R) && (uVar10 = 0, pIVar12 = A, A->size != 0)) {
                    bVar25 = false;
                    IVar3 = i_UNSUPPORTED_CHANNEL_TYPES;
                    goto LAB_001cf1be;
                  }
                }
                pIVar12->offset = uVar16;
                pIVar12->size = uVar19;
                uVar5 = uVar19;
LAB_001cf1a0:
                *wordBytes = uVar5;
                bVar25 = true;
                uVar10 = uVar8;
                uVar18 = uVar19;
                uVar14 = uVar16;
              }
            }
            else {
              pIVar12 = G;
              if (((uVar8 == 0xd) || (pIVar12 = R, uVar8 == 0xe)) || (pIVar12 = A, uVar8 == 0xf))
              goto LAB_001cf0a5;
LAB_001cf170:
              IVar3 = i_UNSUPPORTED_CHANNEL_TYPES;
            }
LAB_001cf1be:
            if (!bVar25) break;
            bVar22 = uVar21 < uVar9;
            puVar11 = puVar11 + 4;
            bVar25 = uVar21 != uVar9 + (uVar9 == 0);
            uVar21 = uVar21 + 1;
          } while (bVar25);
          if (bVar22) {
            return IVar3;
          }
        }
        else {
          *wordBytes = (uint)(byte)DFD[5];
          puVar11 = DFD + 7;
          bVar23 = true;
          uVar17 = 1;
          uVar10 = 0xffffffff;
          uVar18 = 0;
          uVar14 = 0;
          uVar5 = 0;
          do {
            uVar19 = *puVar11;
            uVar8 = uVar19 >> 0x18 & 0xf;
            if (uVar8 < 0xd) {
              pIVar12 = R;
              if (((uVar8 != 0) && (pIVar12 = G, uVar8 != 1)) && (pIVar12 = B, uVar8 != 2))
              goto LAB_001cf301;
LAB_001cf28d:
              uVar16 = uVar19 & 0xffff;
              uVar20 = uVar16 >> 3;
              uVar6 = (uVar19 >> 0x10 & 0xff) + 1;
              if (uVar8 == uVar10) {
                if ((uVar20 == uVar18 - 1) && (((uVar19 | uVar14 + uVar5) & 7) == 0)) {
                  pIVar12->size = pIVar12->size + uVar6;
                  local_7c = local_7c | i_BIG_ENDIAN_FORMAT_BIT;
                  bVar22 = true;
                  uVar8 = uVar10;
                }
                else {
LAB_001cf2c9:
                  bVar22 = false;
                  IVar3 = i_UNSUPPORTED_ERROR_BIT;
                  uVar8 = uVar10;
                  uVar16 = uVar14;
                  uVar20 = uVar18;
                  uVar6 = uVar5;
                }
              }
              else {
                if (pIVar12->size != 0) {
                  uVar10 = uVar8;
                  uVar14 = uVar16;
                  uVar18 = uVar20;
                  uVar5 = uVar6;
                  if ((uVar2 != 2) || (uVar8 != 0)) goto LAB_001cf2c9;
                  if ((pIVar12 == R) && (pIVar12 = A, A->size != 0)) {
                    uVar10 = 0;
                    goto LAB_001cf301;
                  }
                }
                pIVar12->offset = uVar16;
                pIVar12->size = uVar6;
                bVar22 = true;
              }
            }
            else {
              pIVar12 = G;
              if (((uVar8 == 0xd) || (pIVar12 = R, uVar8 == 0xe)) || (pIVar12 = A, uVar8 == 0xf))
              goto LAB_001cf28d;
LAB_001cf301:
              bVar22 = false;
              IVar3 = i_UNSUPPORTED_CHANNEL_TYPES;
              uVar8 = uVar10;
              uVar16 = uVar14;
              uVar20 = uVar18;
              uVar6 = uVar5;
            }
            if (!bVar22) break;
            bVar23 = uVar17 < uVar9;
            puVar11 = puVar11 + 4;
            bVar22 = uVar17 != uVar21;
            uVar17 = uVar17 + 1;
            uVar10 = uVar8;
            uVar18 = uVar20;
            uVar14 = uVar16;
            uVar5 = uVar6;
          } while (bVar22);
          if (bVar23) {
            return IVar3;
          }
          if ((local_7c & i_BIG_ENDIAN_FORMAT_BIT) != i_LITTLE_ENDIAN_FORMAT_BIT) {
            uVar9 = *wordBytes * 8 - 8;
            R->offset = R->offset ^ uVar9;
            G->offset = G->offset ^ uVar9;
            B->offset = B->offset ^ uVar9;
            A->offset = A->offset ^ uVar9;
          }
        }
        if (bVar24) {
          uVar9 = G->size;
          if (G->size < R->size) {
            uVar9 = R->size;
          }
          iVar4 = 0;
          do {
            uVar2 = 1 << ((byte)iVar4 & 0x1f);
            if (uVar9 - 1 < uVar2) goto LAB_001cf3cc;
            iVar4 = iVar4 + 1;
          } while (iVar4 != 0x20);
          uVar2 = 0;
LAB_001cf3cc:
          *wordBytes = uVar2;
        }
      }
    }
  }
  return local_7c;
}

Assistant:

enum InterpretDFDResult interpretDFD(const uint32_t *DFD,
                                     InterpretedDFDChannel *R,
                                     InterpretedDFDChannel *G,
                                     InterpretedDFDChannel *B,
                                     InterpretedDFDChannel *A,
                                     uint32_t *wordBytes)
{
    /* DFD points to the whole descriptor, not the basic descriptor block. */
    /* Make everything else relative to the basic descriptor block. */
    const uint32_t *BDFDB = DFD+1;

    uint32_t numSamples = KHR_DFDSAMPLECOUNT(BDFDB);
    if (numSamples == 0)
        return i_UNSUPPORTED_CHANNEL_TYPES;

    int determinedEndianness = 0;
    enum InterpretDFDResult result = 0; /* Build this up incrementally. */

    bool isDepthStencil = false;

    /* Clear these so following code doesn't get confused. */
    R->offset = R->size = 0;
    G->offset = G->size = 0;
    B->offset = B->size = 0;
    A->offset = A->size = 0;

    /* First rule out the multiple planes case (trivially) */
    /* - that is, we check that only bytesPlane0 is non-zero. */
    /* This means we don't handle multi-plane YUV, even if the API could. */
    /* (We rely on KHR_DF_WORD_BYTESPLANE0..3 being the same and */
    /* KHR_DF_WORD_BYTESPLANE4..7 being the same as a short cut.) */
    if ((BDFDB[KHR_DF_WORD_BYTESPLANE0] & ~KHR_DF_MASK_BYTESPLANE0)
        || BDFDB[KHR_DF_WORD_BYTESPLANE4]) return i_UNSUPPORTED_MULTIPLE_PLANES;

    /* If this is a packed format, we work out our offsets differently. */
    /* We assume a packed format has channels that aren't byte-aligned. */
    /* If we have a format in which every channel is byte-aligned *and* packed, */
    /* we have the RGBA/ABGR ambiguity; we *probably* don't want the packed */
    /* version in this case, and if hardware has to pack it and swizzle, */
    /* that's up to the hardware to special-case. */
    for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
        uint32_t offset = KHR_DFDSVAL(BDFDB, sampleCounter, BITOFFSET);
        uint32_t length = KHR_DFDSVAL(BDFDB, sampleCounter, BITLENGTH) + 1;
        if ((offset & 0x7U) || ((offset + length) & 0x7U)) {
            result |= i_PACKED_FORMAT_BIT;
            /* Once we're packed, we're packed, no need to keep checking. */
            break;
        }
    }

    // Check data types.
    bool hasSigned = false;
    bool hasFloat = false;
    bool hasNormalized = false;
    bool hasFixed = false;
    khr_df_model_e model = KHR_DFDVAL(BDFDB, MODEL);

    // Note: We're ignoring 9995, which is weird and worth special-casing
    // rather than trying to generalise to all float formats.
    for (uint32_t i = 0; i < numSamples; ++i) {
        const bool isSigned = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_SIGNED) != 0;
        const bool isFloat = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_FLOAT) != 0;

        // We define "unnormalized" as "sample_upper = 1" or "sample_upper = 1.0f".
        // We don't check whether any non-1 normalization value is correct
        // (i.e. set to the maximum bit value, and check min value) on
        // the assumption that we're looking at a format which *came* from
        // an API we can support.
        bool isFixed;
        bool isNormalized;
        if (isFloat) {
            isNormalized = *(float*) (void*) &BDFDB[KHR_DF_WORD_SAMPLESTART +
                    KHR_DF_WORD_SAMPLEWORDS * i +
                    KHR_DF_SAMPLEWORD_SAMPLEUPPER] != 1.0f;
            isFixed = false;
        } else {
            uint32_t sampleUpper = KHR_DFDSVAL(BDFDB, i, SAMPLEUPPER);
            uint32_t maxVal = 1U << KHR_DFDSVAL(BDFDB, i, BITLENGTH);
            if (!isSigned) maxVal <<= 1;
            maxVal--;
            isFixed = 1U < sampleUpper && sampleUpper < maxVal;
            isNormalized = !isFixed && sampleUpper != 1U;
        }
        hasSigned |= isSigned;
        hasFixed |= isFixed;
        hasFloat |= isFloat;
        // By our definition the normalizedness of a single bit channel (like in RGBA 5:5:5:1)
        // is ambiguous. Ignore these during normalized checks.
        if (KHR_DFDSVAL(BDFDB, i, BITLENGTH) > 0)
            hasNormalized |= isNormalized;
    }
    result |= hasSigned ? i_SIGNED_FORMAT_BIT : 0;
    result |= hasFloat ? i_FLOAT_FORMAT_BIT : 0;
    result |= hasNormalized ? i_NORMALIZED_FORMAT_BIT : 0;
    result |= hasFixed ? i_FIXED_FORMAT_BIT : 0;

    // Checks based on color model
    if (model == KHR_DF_MODEL_YUVSDA) {
        result |= i_NORMALIZED_FORMAT_BIT;
        result |= i_COMPRESSED_FORMAT_BIT;
        result |= i_YUVSDA_FORMAT_BIT;

        for (uint32_t i = 0; i < numSamples; ++i) {
            switch (KHR_DFDSVAL(BDFDB, i, CHANNELID)) {
            case KHR_DF_CHANNEL_YUVSDA_Y:
            case KHR_DF_CHANNEL_YUVSDA_U:
            case KHR_DF_CHANNEL_YUVSDA_V:
            case KHR_DF_CHANNEL_YUVSDA_A:
                break;
            case KHR_DF_CHANNEL_YUVSDA_DEPTH:
            case KHR_DF_CHANNEL_YUVSDA_STENCIL:
                isDepthStencil = true;
                break;
            default:
                return i_UNSUPPORTED_CHANNEL_TYPES;
            }
        }

        // Determine wordBytes
        uint32_t largestSampleSize = 0;
        for (uint32_t i = 0; i < numSamples; ++i) {
            uint32_t length = KHR_DFDSVAL(BDFDB, i, BITLENGTH) + 1;
            if (largestSampleSize < length)
                largestSampleSize = length;
        }
        *wordBytes = ((result & i_PACKED_FORMAT_BIT) ? 4 : 1) * bit_ceil(largestSampleSize) / 8;

    } else if (KHR_DFDVAL(BDFDB, MODEL) == KHR_DF_MODEL_RGBSDA) {
        /* Check if transfer is sRGB. */
        if (KHR_DFDVAL(BDFDB, TRANSFER) == KHR_DF_TRANSFER_SRGB) result |= i_SRGB_FORMAT_BIT;

        /* We only support samples at coordinate 0,0,0,0. */
        /* (We could confirm this from texel_block_dimensions in 1.2, but */
        /* the interpretation might change in later versions.) */
        for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
            if (KHR_DFDSVAL(BDFDB, sampleCounter, SAMPLEPOSITION_ALL))
                return i_UNSUPPORTED_MULTIPLE_SAMPLE_LOCATIONS;
        }
    }

    if (model == KHR_DF_MODEL_RGBSDA || model == KHR_DF_MODEL_YUVSDA) {
        /* The values of the DEPTH and STENCIL tokens are the same for */
        /* RGBSDA and YUVSDA. */
        /* For Depth/Stencil formats mixed channels are allowed */
        for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
            switch (KHR_DFDSVAL(BDFDB, sampleCounter, CHANNELID)) {
            case KHR_DF_CHANNEL_RGBSDA_DEPTH:
            case KHR_DF_CHANNEL_RGBSDA_STENCIL:
                isDepthStencil = true;
                break;
            default:
                break;
            }
        }

        // Check for mixed channels
        if (!isDepthStencil) {
            for (uint32_t i = 0; i < numSamples; ++i) {
                const bool isSigned = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_SIGNED) != 0;
                const bool isFloat = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_FLOAT) != 0;

                if (isSigned != hasSigned)
                    return i_UNSUPPORTED_MIXED_CHANNELS;
                if (isFloat != hasFloat)
                    return i_UNSUPPORTED_MIXED_CHANNELS;

                // Note: We don't check for inconsistent normalization, because
                // channels composed of multiple samples will have 0 in the
                // lower/upper range. Single bit channels are also ambiguous.
                // This heuristic should handle 64-bit integers, too.
            }
        }

        /* This all relies on the channel id values for RGB being equal to */
        /* those for YUV. */

        /* Remember: the canonical ordering of samples is to start with */
        /* the lowest bit of the channel/location which touches bit 0 of */
        /* the data, when the latter is concatenated in little-endian order, */
        /* and then progress until all the bits of that channel/location */
        /* have been processed. Multiple channels sharing the same source */
        /* bits are processed in channel ID order. (I should clarify this */
        /* for partially-shared data, but it doesn't really matter so long */
        /* as everything is consecutive, except to make things canonical.) */
        /* Note: For standard formats we could determine big/little-endianness */
        /* simply from whether the first sample starts in bit 0; technically */
        /* it's possible to have a format with unaligned channels wherein the */
        /* first channel starts at bit 0 and is one byte, yet other channels */
        /* take more bytes or aren't aligned (e.g. D24S8), but this should be */
        /* irrelevant for the formats that we support. */
        if ((result & i_PACKED_FORMAT_BIT)) {
            /* A packed format. */
            uint32_t currentChannel = ~0U; /* Don't start matched. */
            uint32_t currentBitOffset = 0;
            uint32_t currentByteOffset = 0;
            uint32_t currentBitLength = 0;
            *wordBytes = (BDFDB[KHR_DF_WORD_BYTESPLANE0] & 0xFFU);
            for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
                uint32_t sampleBitOffset = KHR_DFDSVAL(BDFDB, sampleCounter, BITOFFSET);
                uint32_t sampleByteOffset = sampleBitOffset >> 3U;
                /* The sample bitLength field stores the bit length - 1. */
                uint32_t sampleBitLength = KHR_DFDSVAL(BDFDB, sampleCounter, BITLENGTH) + 1;
                uint32_t sampleChannel = KHR_DFDSVAL(BDFDB, sampleCounter, CHANNELID);
                InterpretedDFDChannel *sampleChannelPtr;
                switch (sampleChannel) {
                case KHR_DF_CHANNEL_RGBSDA_RED:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_GREEN:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_BLUE:
                    sampleChannelPtr = B;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_DEPTH:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_STENCIL:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_ALPHA:
                    sampleChannelPtr = A;
                    break;
                default:
                    return i_UNSUPPORTED_CHANNEL_TYPES;
                }
                if (sampleChannel == currentChannel) {
                    /* Continuation of the same channel. */
                    /* Since a big (>32-bit) channel isn't "packed", */
                    /* this should only happen in big-endian, or if */
                    /* we have a wacky format that we won't support. */
                    if (sampleByteOffset == currentByteOffset - 1U && /* One byte earlier */
                        ((currentBitOffset + currentBitLength) & 7U) == 0 && /* Already at the end of a byte */
                        (sampleBitOffset & 7U) == 0) { /* Start at the beginning of the byte */
                        /* All is good, continue big-endian. */
                        /* N.B. We shouldn't be here if we decided we were little-endian, */
                        /* so we don't bother to check that disagreement. */
                        result |= i_BIG_ENDIAN_FORMAT_BIT;
                        determinedEndianness = 1;
                    } else {
                        /* Oh dear. */
                        /* We could be little-endian, but not with any standard format. */
                        /* More likely we've got something weird that we can't support. */
                        return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                    }
                    /* Remember where we are. */
                    currentBitOffset = sampleBitOffset;
                    currentByteOffset = sampleByteOffset;
                    currentBitLength = sampleBitLength;
                    /* Accumulate the bit length. */
                    sampleChannelPtr->size += sampleBitLength;
                } else {
                    /* Everything is new. Hopefully. */
                    currentChannel = sampleChannel;
                    currentBitOffset = sampleBitOffset;
                    currentByteOffset = sampleByteOffset;
                    currentBitLength = sampleBitLength;
                    if (sampleChannelPtr->size) {
                        if (model == KHR_DF_MODEL_YUVSDA && sampleChannel == KHR_DF_CHANNEL_YUVSDA_Y) {
                            if (sampleChannelPtr == R) {
                                /* We've got another Y channel. Record details in A. */
                                if (A->size == 0) {
                                    sampleChannelPtr = A;
                                } else {
                                    /* Uh-oh, we've already got a second Y or an alpha channel. */
                                    return i_UNSUPPORTED_CHANNEL_TYPES;
                                }
                            }
                        } else {
                          /* Uh-oh, we've seen this channel before. */
                          return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                    }
                    /* For now, record the bit offset in little-endian terms, */
                    /* because we may not know to reverse it yet. */
                    sampleChannelPtr->offset = sampleBitOffset;
                    sampleChannelPtr->size = sampleBitLength;
                }
            }
            if ((result & i_BIG_ENDIAN_FORMAT_BIT)) {
                /* Our bit offsets to bit 0 of each channel are in little-endian terms. */
                /* We need to do a byte swap to work out where they should be. */
                /* We assume, for sanity, that byte sizes are a power of two for this. */
                uint32_t offsetMask = (*wordBytes - 1U) << 3U;
                R->offset ^= offsetMask;
                G->offset ^= offsetMask;
                B->offset ^= offsetMask;
                A->offset ^= offsetMask;
            }
        } else {
            /* Not a packed format. */
            /* Everything is byte-aligned. */
            /* Question is whether there multiple samples per channel. */
            uint32_t currentChannel = ~0U; /* Don't start matched. */
            uint32_t currentByteOffset = 0;
            uint32_t currentByteLength = 0;
            for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
                uint32_t sampleByteOffset = KHR_DFDSVAL(BDFDB, sampleCounter, BITOFFSET) >> 3U;
                uint32_t sampleByteLength = (KHR_DFDSVAL(BDFDB, sampleCounter, BITLENGTH) + 1) >> 3U;
                uint32_t sampleChannel = KHR_DFDSVAL(BDFDB, sampleCounter, CHANNELID);
                InterpretedDFDChannel *sampleChannelPtr;
                switch (sampleChannel) {
                case KHR_DF_CHANNEL_RGBSDA_RED:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_GREEN:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_BLUE:
                    sampleChannelPtr = B;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_DEPTH:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_STENCIL:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_ALPHA:
                    sampleChannelPtr = A;
                    break;
                default:
                    return i_UNSUPPORTED_CHANNEL_TYPES;
                }
                if (sampleChannel == currentChannel) {
                    /* Continuation of the same channel. */
                    /* Either big-endian, or little-endian with a very large channel. */
                    if (sampleByteOffset == currentByteOffset - 1) { /* One byte earlier */
                        if (determinedEndianness && !(result & i_BIG_ENDIAN_FORMAT_BIT)) {
                            return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                        /* All is good, continue big-endian. */
                        result |= i_BIG_ENDIAN_FORMAT_BIT;
                        determinedEndianness = 1;
                        /* Update the start */
                        sampleChannelPtr->offset = sampleByteOffset;
                    } else if (sampleByteOffset == currentByteOffset + currentByteLength) {
                        if (determinedEndianness && (result & i_BIG_ENDIAN_FORMAT_BIT)) {
                            return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                        /* All is good, continue little-endian. */
                        determinedEndianness = 1;
                    } else {
                        /* Oh dear. */
                        /* We could be little-endian, but not with any standard format. */
                        /* More likely we've got something weird that we can't support. */
                        return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                    }
                    /* Remember where we are. */
                    currentByteOffset = sampleByteOffset;
                    currentByteLength = sampleByteLength;
                    /* Accumulate the byte length. */
                    sampleChannelPtr->size += sampleByteLength;
                    /* Assume these are all the same. */
                    *wordBytes = sampleChannelPtr->size;
                } else {
                    /* Everything is new. Hopefully. */
                    currentChannel = sampleChannel;
                    currentByteOffset = sampleByteOffset;
                    currentByteLength = sampleByteLength;
                    if (sampleChannelPtr->size) {
                        if (model == KHR_DF_MODEL_YUVSDA && sampleChannel == KHR_DF_CHANNEL_YUVSDA_Y) {
                            if (sampleChannelPtr == R) {
                                /* We've got another Y channel. Record details in A. */
                                if (A->size == 0) {
                                    sampleChannelPtr = A;
                                } else {
                                    /* Uh-oh, we've already got a second Y or an alpha channel. */
                                    return i_UNSUPPORTED_CHANNEL_TYPES;
                                }
                            }
                        } else {
                          /* Uh-oh, we've seen this channel before. */
                          return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                    }
                    /* For now, record the byte offset in little-endian terms, */
                    /* because we may not know to reverse it yet. */
                    sampleChannelPtr->offset = sampleByteOffset;
                    sampleChannelPtr->size = sampleByteLength;
                    /* Assume these are all the same. */
                    *wordBytes = sampleByteLength;
                }
            }
        }
    } else {
        return i_UNSUPPORTED_CHANNEL_TYPES;
    }

    if (isDepthStencil) {
        /* For Depth/Stencil formats wordBytes is determined by the required alignment of */
        /* the larger channel. */
        uint32_t largerSize = R->size > G->size ? R->size : G->size;
        *wordBytes = bit_ceil(largerSize);
    }

    return result;
}